

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O2

void __thiscall QPainter::fillRect(QPainter *this,int x,int y,int w,int h,GlobalColor c)

{
  long in_FS_OFFSET;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  QColor local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = x + -1 + w;
  local_34 = y + -1 + h;
  local_40 = x;
  local_3c = y;
  QColor::QColor(&local_30,c);
  QPainter::fillRect((QRect *)this,(QColor *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::fillRect(int x, int y, int w, int h, Qt::GlobalColor c)
{
    fillRect(QRect(x, y, w, h), QColor(c));
}